

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac.c
# Opt level: O3

HMAC_context * Curl_HMAC_init(HMAC_params *hashparams,uchar *key,uint keylen)

{
  ulong in_RAX;
  HMAC_context *pHVar1;
  ulong uVar2;
  HMAC_context *pHVar3;
  ulong uVar4;
  uchar b;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  pHVar1 = (HMAC_context *)
           (*Curl_cmalloc)((ulong)(hashparams->ctxtsize * 2) + (ulong)hashparams->resultlen + 0x18);
  if (pHVar1 != (HMAC_context *)0x0) {
    pHVar1->hash = hashparams;
    pHVar3 = pHVar1 + 1;
    pHVar1->hashctxt1 = pHVar3;
    pHVar1->hashctxt2 = (void *)((long)&pHVar1[1].hash + (ulong)hashparams->ctxtsize);
    if (hashparams->maxkeylen < keylen) {
      (*hashparams->hinit)(pHVar3);
      (*hashparams->hupdate)(pHVar1->hashctxt1,key,keylen);
      key = (uchar *)((ulong)hashparams->ctxtsize + (long)pHVar1->hashctxt2);
      (*hashparams->hfinal)(key,pHVar1->hashctxt1);
      keylen = hashparams->resultlen;
      pHVar3 = (HMAC_context *)pHVar1->hashctxt1;
    }
    (*hashparams->hinit)(pHVar3);
    (*hashparams->hinit)(pHVar1->hashctxt2);
    uVar4 = (ulong)keylen;
    if (keylen != 0) {
      uVar2 = 0;
      do {
        uStack_38 = CONCAT17(key[uVar2],(undefined7)uStack_38) ^ 0x3600000000000000;
        (*hashparams->hupdate)(pHVar1->hashctxt1,(uchar *)((long)&uStack_38 + 7),1);
        uStack_38 = CONCAT17(key[uVar2],(undefined7)uStack_38) ^ 0x5c00000000000000;
        (*hashparams->hupdate)(pHVar1->hashctxt2,(uchar *)((long)&uStack_38 + 7),1);
        uVar2 = uVar2 + 1;
      } while (uVar4 != uVar2);
    }
    if (keylen < hashparams->maxkeylen) {
      do {
        (*hashparams->hupdate)(pHVar1->hashctxt1,"6\\",1);
        (*hashparams->hupdate)(pHVar1->hashctxt2,"\\",1);
        uVar4 = uVar4 + 1;
      } while (uVar4 < hashparams->maxkeylen);
    }
  }
  return pHVar1;
}

Assistant:

struct HMAC_context *
Curl_HMAC_init(const struct HMAC_params *hashparams,
               const unsigned char *key,
               unsigned int keylen)
{
  size_t i;
  struct HMAC_context *ctxt;
  unsigned char *hkey;
  unsigned char b;

  /* Create HMAC context. */
  i = sizeof(*ctxt) + 2 * hashparams->ctxtsize + hashparams->resultlen;
  ctxt = malloc(i);

  if(!ctxt)
    return ctxt;

  ctxt->hash = hashparams;
  ctxt->hashctxt1 = (void *) (ctxt + 1);
  ctxt->hashctxt2 = (void *) ((char *) ctxt->hashctxt1 + hashparams->ctxtsize);

  /* If the key is too long, replace it by its hash digest. */
  if(keylen > hashparams->maxkeylen) {
    hashparams->hinit(ctxt->hashctxt1);
    hashparams->hupdate(ctxt->hashctxt1, key, keylen);
    hkey = (unsigned char *) ctxt->hashctxt2 + hashparams->ctxtsize;
    hashparams->hfinal(hkey, ctxt->hashctxt1);
    key = hkey;
    keylen = hashparams->resultlen;
  }

  /* Prime the two hash contexts with the modified key. */
  hashparams->hinit(ctxt->hashctxt1);
  hashparams->hinit(ctxt->hashctxt2);

  for(i = 0; i < keylen; i++) {
    b = (unsigned char)(*key ^ hmac_ipad);
    hashparams->hupdate(ctxt->hashctxt1, &b, 1);
    b = (unsigned char)(*key++ ^ hmac_opad);
    hashparams->hupdate(ctxt->hashctxt2, &b, 1);
  }

  for(; i < hashparams->maxkeylen; i++) {
    hashparams->hupdate(ctxt->hashctxt1, &hmac_ipad, 1);
    hashparams->hupdate(ctxt->hashctxt2, &hmac_opad, 1);
  }

  /* Done, return pointer to HMAC context. */
  return ctxt;
}